

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

void cmime_message_set_subject_encode(CMimeMessage_T *message,char *s)

{
  char *s_00;
  char *encoded;
  char *s_local;
  CMimeMessage_T *message_local;
  
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x40c,"void cmime_message_set_subject_encode(CMimeMessage_T *, const char *)");
  }
  if (s != (char *)0x0) {
    s_00 = cmime_string_encode_to_7bit(s,CMIME_STRING_ENCODING_B64);
    cmime_message_set_subject(message,s_00);
    free(s_00);
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x40d,"void cmime_message_set_subject_encode(CMimeMessage_T *, const char *)");
}

Assistant:

void cmime_message_set_subject_encode(CMimeMessage_T *message, const char *s) {
    char *encoded = NULL;

    assert(message);
    assert(s);

    encoded = cmime_string_encode_to_7bit(s,CMIME_STRING_ENCODING_B64);

    cmime_message_set_subject(message, encoded);
    free(encoded);
}